

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

ER __thiscall
slang::ast::ForeverLoopStatement::evalImpl(ForeverLoopStatement *this,EvalContext *context)

{
  ER EVar1;
  ER EVar2;
  ER unaff_EBX;
  
  do {
    EVar1 = Statement::eval(this->body,context);
    if (EVar1 == Success) {
LAB_00280342:
      EVar2 = Fail;
    }
    else {
      EVar2 = EVar1;
      if (EVar1 != Break) {
        if (EVar1 == Continue) goto LAB_00280342;
        EVar2 = Success;
        unaff_EBX = EVar1;
      }
    }
    if (EVar2 != Fail) {
      if (EVar2 != Success) {
        unaff_EBX = Success;
      }
      return unaff_EBX;
    }
  } while( true );
}

Assistant:

ER ForeverLoopStatement::evalImpl(EvalContext& context) const {
    while (true) {
        ER result = body.eval(context);
        if (result != ER::Success) {
            if (result == ER::Break)
                break;
            else if (result != ER::Continue)
                return result;
        }
    }

    return ER::Success;
}